

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell::createTest
          (TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_Test *this_00;
  TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell *this_local;
  
  this_00 = (TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x226);
  TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_Test::
  TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithDifferentFileAndLine)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test failed", "importantFile", 999)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"importantFile:999: Test failed\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}